

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void * NULLC::GetBasePointer(void *ptr)

{
  uint *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  pvVar2 = ObjectBlockPool<8,_8192>::GetBasePointer((ObjectBlockPool<8,_8192> *)pool8,ptr);
  if (((((pvVar2 == (void *)0x0) &&
        (pvVar2 = ObjectBlockPool<16,_4096>::GetBasePointer((ObjectBlockPool<16,_4096> *)pool16,ptr)
        , pvVar2 == (void *)0x0)) &&
       (pvVar2 = ObjectBlockPool<32,_2048>::GetBasePointer((ObjectBlockPool<32,_2048> *)pool32,ptr),
       pvVar2 == (void *)0x0)) &&
      ((pvVar2 = ObjectBlockPool<64,_1024>::GetBasePointer((ObjectBlockPool<64,_1024> *)pool64,ptr),
       pvVar2 == (void *)0x0 &&
       (pvVar2 = ObjectBlockPool<128,_512>::GetBasePointer((ObjectBlockPool<128,_512> *)pool128,ptr)
       , pvVar2 == (void *)0x0)))) &&
     ((pvVar2 = ObjectBlockPool<256,_256>::GetBasePointer((ObjectBlockPool<256,_256> *)pool256,ptr),
      pvVar2 == (void *)0x0 &&
      (pvVar2 = ObjectBlockPool<512,_128>::GetBasePointer((ObjectBlockPool<512,_128> *)pool512,ptr),
      pvVar2 == (void *)0x0)))) {
    pvVar2 = (void *)0x0;
    for (puVar3 = (undefined8 *)bigBlocks._24_8_; puVar3 != (undefined8 *)0x0;
        puVar3 = (undefined8 *)puVar3[(ulong)(puVar1 <= ptr) + 2]) {
      puVar1 = (uint *)*puVar3;
      if ((puVar1 <= ptr) && (ptr <= (void *)puVar3[1])) {
        if ((void *)((ulong)*puVar1 + (long)puVar1) < ptr) {
          return (void *)0x0;
        }
        return puVar1 + 3;
      }
    }
  }
  return pvVar2;
}

Assistant:

void* NULLC::GetBasePointer(void* ptr)
{
	// Search in range of every pool
	if(void *base = pool8.GetBasePointer(ptr))
		return base;
	if(void *base = pool16.GetBasePointer(ptr))
		return base;
	if(void *base = pool32.GetBasePointer(ptr))
		return base;
	if(void *base = pool64.GetBasePointer(ptr))
		return base;
	if(void *base = pool128.GetBasePointer(ptr))
		return base;
	if(void *base = pool256.GetBasePointer(ptr))
		return base;
	if(void *base = pool512.GetBasePointer(ptr))
		return base;

	// Search in global pool
	if(BigBlockIterator it = bigBlocks.find(Range(ptr, ptr)))
	{
		void *block = it->key.start;

		if(ptr >= block && ptr <= (char*)block + *(unsigned int*)block)
			return (char*)block + 4 + sizeof(markerType);
	}

	return NULL;
}